

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O2

DFsSection * __thiscall DFsScript::FindSectionEnd(DFsScript *this,char *brace)

{
  TObjPtr<DFsSection> *obj;
  DFsSection *pDVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x11) {
      return (DFsSection *)0x0;
    }
    obj = this->sections + lVar2;
    while (pDVar1 = GC::ReadBarrier<DFsSection>((DFsSection **)obj), pDVar1 != (DFsSection *)0x0) {
      if (this->data + pDVar1->end_index == brace) {
        return pDVar1;
      }
      obj = &pDVar1->next;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

DFsSection *DFsScript::FindSectionEnd(const char *brace)
{
	int n;
	
	// hash table is no use, they are hashed according to
	// the offset of the starting brace
	
	// we have to go through every entry to find from the
	// ending brace
	
	for(n=0; n<SECTIONSLOTS; n++)      // check all sections in all chains
	{
		DFsSection *current = sections[n];
		
		while(current)
		{
			if(SectionEnd(current) == brace) return current;        // found it
			current = current->next;
		}
	}
	return NULL;    // not found
}